

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::UniformLocArraysNonSpaced::Run(UniformLocArraysNonSpaced *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  Uniform local_428;
  UniformType local_250;
  UniformType local_1c0;
  UniformType local_130;
  UniformType local_a0;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_a0,0x1406,3);
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_a0,(Loc)ZEXT812(2),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_a0);
  UniformType::UniformType(&local_130,0x8b51,2);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_130,(Loc)ZEXT812(5),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_130);
  UniformType::UniformType(&local_1c0,0x1404,3);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_1c0,(Loc)ZEXT812(7),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_1c0);
  UniformType::UniformType(&local_250,0x8b55,0);
  anon_unknown_0::Uniform::Uniform
            (&local_428,generator,&local_250,(Loc)ZEXT812(10),(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&uniforms,&local_428);
  anon_unknown_0::Uniform::~Uniform(&local_428);
  UniformType::~UniformType(&local_250);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&uniforms);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform float[3] u0;
		//layout (location = 5) uniform vec3[2]  u1;
		//layout (location = 7) uniform int[3]   u2;
		//layout (location = 10) uniform ivec4   u3;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::C(2)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT_VEC3, 2), Loc::C(5)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_INT, 3), Loc::C(7)));
		uniforms.push_back(Uniform(uniformValueGenerator, GL_INT_VEC4, Loc::C(10)));
		return doRun(uniforms);
	}